

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Segment::DoLoadCluster(Segment *this,longlong *pos,long *len)

{
  long lVar1;
  Cluster *this_00;
  bool bVar2;
  int iVar3;
  longlong lVar4;
  longlong lVar5;
  ulong uVar6;
  Cues *pCVar7;
  longlong *plVar8;
  Cluster *pCVar9;
  Cluster **ppCVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong local_60;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  
  if (this->m_pos < 0) {
    lVar12 = DoLoadClusterUnknownSize(this,pos,len);
    return lVar12;
  }
  iVar3 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&total,&avail);
  if (iVar3 < 0) {
    lVar12 = (long)iVar3;
  }
  else {
    lVar12 = -2;
    if ((total < 0) || (avail <= total)) {
      lVar12 = this->m_pos;
      lVar13 = this->m_start + this->m_size;
      if (this->m_size < 0) {
        lVar13 = -1;
      }
      do {
        if (-1 < total && total <= lVar12) {
          return 1;
        }
        if (-1 < lVar13 && lVar13 <= lVar12) {
          return 1;
        }
        *pos = lVar12;
        if (avail <= lVar12) {
LAB_0010c0e1:
          *len = 1;
          return -3;
        }
        lVar4 = GetUIntLength(this->m_pReader,lVar12,len);
        if (lVar4 < 0) {
          return lVar4;
        }
        if (lVar4 != 0) {
          return -3;
        }
        lVar11 = *pos;
        if (-1 < lVar13 && lVar13 < *len + lVar11) {
          return -2;
        }
        if (avail < *len + lVar11) {
          return -3;
        }
        lVar4 = ReadID(this->m_pReader,lVar11,len);
        if (lVar4 < 0) {
          return -2;
        }
        lVar12 = *pos + *len;
        *pos = lVar12;
        if (avail <= lVar12) goto LAB_0010c0e1;
        lVar5 = GetUIntLength(this->m_pReader,lVar12,len);
        if (lVar5 < 0) {
          return lVar5;
        }
        if (lVar5 != 0) {
          return -3;
        }
        lVar12 = *len + *pos;
        if (-1 < lVar13 && lVar13 < lVar12) {
          return -2;
        }
        if (avail < lVar12) {
          return -3;
        }
        local_60 = ReadUInt(this->m_pReader,*pos,len);
        if ((long)local_60 < 0) {
          return local_60;
        }
        lVar1 = *len;
        lVar14 = *pos + lVar1;
        *pos = lVar14;
        lVar12 = lVar14;
        if (local_60 != 0) {
          uVar6 = -1L << ((char)lVar1 * '\a' & 0x3fU) ^ local_60;
          lVar12 = lVar14 + local_60;
          if (((-1 < lVar13) && (uVar6 != 0xffffffffffffffff)) && (lVar13 < lVar12)) {
            return -2;
          }
          if (lVar4 == 0x1c53bb6b) {
            if (uVar6 == 0xffffffffffffffff) {
              return -2;
            }
            if (this->m_pCues == (Cues *)0x0) {
              pCVar7 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              if (pCVar7 == (Cues *)0x0) {
                this->m_pCues = (Cues *)0x0;
                return -1;
              }
              pCVar7->m_pSegment = this;
              pCVar7->m_start = lVar14;
              pCVar7->m_size = local_60;
              pCVar7->m_element_start = lVar11;
              pCVar7->m_element_size = (local_60 - lVar11) + lVar14;
              pCVar7->m_preload_count = 0;
              pCVar7->m_cue_points = (CuePoint **)0x0;
              pCVar7->m_count = 0;
              pCVar7->m_pos = lVar14;
              this->m_pCues = pCVar7;
            }
          }
          else {
            if (lVar4 == 0x1f43b675) {
              if (uVar6 == 0xffffffffffffffff) {
                local_60 = 0xffffffffffffffff;
              }
              lVar11 = lVar11 - this->m_start;
              if (lVar11 < 0) {
                return -2;
              }
              lVar12 = Cluster::HasBlockEntries(this,lVar11,&pos_,&len_);
              if (lVar12 < 0) {
                *pos = pos_;
                *len = len_;
                return lVar12;
              }
              lVar1 = this->m_clusterCount;
              if (0 < this->m_clusterPreloadCount) {
                if (this->m_clusterSize <= lVar1) {
                  return -2;
                }
                pCVar9 = this->m_clusters[lVar1];
                if (pCVar9 == (Cluster *)0x0) {
                  return -2;
                }
                if (-1 < pCVar9->m_index) {
                  return -2;
                }
                lVar4 = Cluster::GetPosition(pCVar9);
                if (lVar4 == lVar11) {
                  if (lVar12 == 0) {
                    return -2;
                  }
                  plVar8 = pos;
                  if ((long)local_60 < 0) {
                    local_60 = pCVar9->m_element_size;
                    if ((long)local_60 < 1) {
                      return -2;
                    }
                    plVar8 = &pCVar9->m_element_start;
                  }
                  lVar12 = local_60 + *plVar8;
                  *pos = lVar12;
                  pCVar9->m_index = lVar1;
                  this->m_clusterCount = this->m_clusterCount + 1;
                  this->m_clusterPreloadCount = this->m_clusterPreloadCount + -1;
                  this->m_pos = lVar12;
                  bVar2 = lVar12 <= lVar13 || lVar13 < 0;
                  goto LAB_0010c318;
                }
              }
              if (lVar12 == 0) {
                lVar12 = *pos;
                if (-1 < (long)local_60) {
                  lVar12 = lVar12 + local_60;
                  *pos = lVar12;
                }
                if (((total < 0) || (lVar12 < total)) &&
                   ((lVar13 < 0 || (total = lVar13, lVar12 < lVar13)))) {
                  this->m_pos = lVar12;
                  return 2;
                }
                this->m_pos = total;
                return 1;
              }
              pCVar9 = Cluster::Create(this,lVar1,lVar11);
              if (pCVar9 == (Cluster *)0x0) {
                return -1;
              }
              if ((this->m_type == kTypeLiveStream) &&
                 (ppCVar10 = this->m_clusters, ppCVar10 != (Cluster **)0x0)) {
                lVar12 = pCVar9->m_index;
                this_00 = ppCVar10[lVar12 + -1];
                if (this_00 != (Cluster *)0x0) {
                  Cluster::~Cluster(this_00);
                  operator_delete(this_00);
                  ppCVar10 = this->m_clusters;
                  lVar12 = pCVar9->m_index;
                }
                ppCVar10[lVar12 + -1] = pCVar9;
              }
              else {
                bVar2 = AppendCluster(this,pCVar9);
                if (!bVar2) {
                  Cluster::~Cluster(pCVar9);
                  operator_delete(pCVar9);
                  return -1;
                }
              }
              if ((long)local_60 < 0) {
                this->m_pUnknownSize = pCVar9;
                this->m_pos = -*pos;
                return 0;
              }
              lVar12 = local_60 + *pos;
              *pos = lVar12;
              this->m_pos = lVar12;
              bVar2 = lVar12 <= lVar13 || lVar13 < 1;
LAB_0010c318:
              return (ulong)bVar2 * 2 + -2;
            }
            if (uVar6 == 0xffffffffffffffff) {
              return -2;
            }
          }
        }
        this->m_pos = lVar12;
      } while( true );
    }
  }
  return lVar12;
}

Assistant:

long Segment::DoLoadCluster(long long& pos, long& len) {
  if (m_pos < 0)
    return DoLoadClusterUnknownSize(pos, len);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  long long cluster_off = -1;  // offset relative to start of segment
  long long cluster_size = -1;  // size of cluster payload

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      return 1;  // no more clusters

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      return 1;  // no more clusters

    pos = m_pos;

    // Read ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // pos now points to start of payload

    if (size == 0) {
      // Missing element payload: move on.
      m_pos = pos;
      continue;
    }

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size) {
        // Cues element of unknown size: Not supported.
        return E_FILE_FORMAT_INVALID;
      }

      if (m_pCues == NULL) {
        const long long element_size = (pos - idpos) + size;

        m_pCues = new (std::nothrow) Cues(this, pos, size, idpos, element_size);
        if (m_pCues == NULL)
          return -1;
      }

      m_pos = pos + size;  // consume payload
      continue;
    }

    if (id != libwebm::kMkvCluster) {
      // Besides the Segment, Libwebm allows only cluster elements of unknown
      // size. Fail the parse upon encountering a non-cluster element reporting
      // unknown size.
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      m_pos = pos + size;  // consume payload
      continue;
    }

    // We have a cluster.

    cluster_off = idpos - m_start;  // relative pos

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  if (cluster_off < 0) {
    // No cluster, die.
    return E_FILE_FORMAT_INVALID;
  }

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, cluster_off, pos_, len_);

  if (status < 0) {  // error, or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  // status == 0 means "no block entries found"
  // status > 0 means "found at least one block entry"

  // TODO:
  // The issue here is that the segment increments its own
  // pos ptr past the most recent cluster parsed, and then
  // starts from there to parse the next cluster.  If we
  // don't know the size of the current cluster, then we
  // must either parse its payload (as we do below), looking
  // for the cluster (or cues) ID to terminate the parse.
  // This isn't really what we want: rather, we really need
  // a way to create the curr cluster object immediately.
  // The pity is that cluster::parse can determine its own
  // boundary, and we largely duplicate that same logic here.
  //
  // Maybe we need to get rid of our look-ahead preloading
  // in source::parse???
  //
  // As we're parsing the blocks in the curr cluster
  //(in cluster::parse), we should have some way to signal
  // to the segment that we have determined the boundary,
  // so it can adjust its own segment::m_pos member.
  //
  // The problem is that we're asserting in asyncreadinit,
  // because we adjust the pos down to the curr seek pos,
  // and the resulting adjusted len is > 2GB.  I'm suspicious
  // that this is even correct, but even if it is, we can't
  // be loading that much data in the cache anyway.

  const long idx = m_clusterCount;

  if (m_clusterPreloadCount > 0) {
    if (idx >= m_clusterSize)
      return E_FILE_FORMAT_INVALID;

    Cluster* const pCluster = m_clusters[idx];
    if (pCluster == NULL || pCluster->m_index >= 0)
      return E_FILE_FORMAT_INVALID;

    const long long off = pCluster->GetPosition();
    if (off < 0)
      return E_FILE_FORMAT_INVALID;

    if (off == cluster_off) {  // preloaded already
      if (status == 0)  // no entries found
        return E_FILE_FORMAT_INVALID;

      if (cluster_size >= 0)
        pos += cluster_size;
      else {
        const long long element_size = pCluster->GetElementSize();

        if (element_size <= 0)
          return E_FILE_FORMAT_INVALID;  // TODO: handle this case

        pos = pCluster->m_element_start + element_size;
      }

      pCluster->m_index = idx;  // move from preloaded to loaded
      ++m_clusterCount;
      --m_clusterPreloadCount;

      m_pos = pos;  // consume payload
      if (segment_stop >= 0 && m_pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      return 0;  // success
    }
  }

  if (status == 0) {  // no entries found
    if (cluster_size >= 0)
      pos += cluster_size;

    if ((total >= 0) && (pos >= total)) {
      m_pos = total;
      return 1;  // no more clusters
    }

    if ((segment_stop >= 0) && (pos >= segment_stop)) {
      m_pos = segment_stop;
      return 1;  // no more clusters
    }

    m_pos = pos;
    return 2;  // try again
  }

  // status > 0 means we have an entry

  Cluster* const pCluster = Cluster::Create(this, idx, cluster_off);
  if (pCluster == NULL)
    return -1;

  if (m_type != kTypeLiveStream || m_clusters == nullptr)
  {
    if (!AppendCluster(pCluster)) {
        delete pCluster;
        return -1;
    }
  } else { // m_type == kTypeLiveStream
      if (m_clusters[pCluster->m_index - 1] != nullptr) {
          delete m_clusters[pCluster->m_index - 1];
      }
      m_clusters[pCluster->m_index - 1] = pCluster;
  }

  if (cluster_size >= 0) {
    pos += cluster_size;

    m_pos = pos;

    if (segment_stop > 0 && m_pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    return 0;
  }

  m_pUnknownSize = pCluster;
  m_pos = -pos;

  return 0;  // partial success, since we have a new cluster

  // status == 0 means "no block entries found"
  // pos designates start of payload
  // m_pos has NOT been adjusted yet (in case we need to come back here)
}